

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O2

void * __thiscall CRingBufferBase::Allocate(CRingBufferBase *this,int Size)

{
  CItem *pCVar1;
  int iVar2;
  CItem *pCVar3;
  CItem *pCVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = (int)((long)Size + 0x2fU) - (int)(((long)Size + 0x2fU) % 0x18);
  if (iVar6 <= this->m_Size) {
    do {
      pCVar3 = this->m_pProduce;
      if ((pCVar3->m_Free != 0) &&
         ((iVar2 = pCVar3->m_Size, iVar6 <= iVar2 ||
          ((pCVar3 = this->m_pFirst, pCVar3->m_Free != 0 && (iVar2 = pCVar3->m_Size, iVar6 <= iVar2)
           ))))) {
        if (iVar6 + 0x18 < iVar2) {
          lVar5 = (long)iVar6;
          pCVar4 = (CItem *)((long)&pCVar3->m_pPrev + lVar5);
          *(CItem **)((long)&pCVar3->m_pPrev + lVar5) = pCVar3;
          pCVar1 = pCVar3->m_pNext;
          *(CItem **)((long)&pCVar3->m_pNext + lVar5) = pCVar1;
          if (pCVar1 != (CItem *)0x0) {
            pCVar1->m_pPrev = pCVar4;
          }
          pCVar3->m_pNext = pCVar4;
          pCVar4->m_Free = 1;
          pCVar4->m_Size = iVar2 - iVar6;
          pCVar3->m_Size = iVar6;
          if (pCVar4->m_pNext == (CItem *)0x0) {
            this->m_pLast = pCVar4;
          }
        }
        else {
          pCVar4 = pCVar3->m_pNext;
        }
        if (pCVar4 == (CItem *)0x0) {
          pCVar4 = this->m_pFirst;
        }
        this->m_pProduce = pCVar4;
        pCVar3->m_Free = 0;
        return pCVar3 + 1;
      }
    } while (((this->m_Flags & 1) != 0) && (iVar2 = PopFirst(this), iVar2 != 0));
  }
  return (void *)0x0;
}

Assistant:

void *CRingBufferBase::Allocate(int Size)
{
	int WantedSize = (Size+sizeof(CItem)+sizeof(CItem)-1)/sizeof(CItem)*sizeof(CItem);
	CItem *pBlock = 0;

	// check if we even can fit this block
	if(WantedSize > m_Size)
		return 0;

	while(1)
	{
		// check for space
		if(m_pProduce->m_Free)
		{
			if(m_pProduce->m_Size >= WantedSize)
				pBlock = m_pProduce;
			else
			{
				// wrap around to try to find a block
				if(m_pFirst->m_Free && m_pFirst->m_Size >= WantedSize)
					pBlock = m_pFirst;
			}
		}

		if(pBlock)
			break;
		else
		{
			// we have no block, check our policy and see what todo
			if(m_Flags&FLAG_RECYCLE)
			{
				if(!PopFirst())
					return 0;
			}
			else
				return 0;
		}
	}

	// okey, we have our block

	// split the block if needed
	if(pBlock->m_Size > WantedSize+(int)sizeof(CItem))
	{
		CItem *pNewItem = (CItem *)((char *)pBlock + WantedSize);
		pNewItem->m_pPrev = pBlock;
		pNewItem->m_pNext = pBlock->m_pNext;
		if(pNewItem->m_pNext)
			pNewItem->m_pNext->m_pPrev = pNewItem;
		pBlock->m_pNext = pNewItem;

		pNewItem->m_Free = 1;
		pNewItem->m_Size = pBlock->m_Size - WantedSize;
		pBlock->m_Size = WantedSize;

		if(!pNewItem->m_pNext)
			m_pLast = pNewItem;
	}


	// set next block
	m_pProduce = NextBlock(pBlock);

	// set as used and return the item pointer
	pBlock->m_Free = 0;
	return (void *)(pBlock+1);
}